

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O2

bool __thiscall auto_array<short>::pop(auto_array<short> *this,short *elements,size_t length)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = this->length_;
  if (length <= uVar1) {
    uVar2 = uVar1;
    if (elements != (short *)0x0) {
      memcpy(elements,this->data_,length * 2);
      uVar2 = this->length_;
    }
    memmove(this->data_,this->data_ + length,(uVar2 - length) * 2);
    this->length_ = this->length_ - length;
  }
  return length <= uVar1;
}

Assistant:

bool pop(T * elements, size_t length)
  {
    if (length > length_) {
      return false;
    }
    if (elements) {
      PodCopy(elements, data_, length);
    }
    PodMove(data_, data_ + length, length_ - length);

    length_ -= length;

    return true;
  }